

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

void __thiscall Time::Time(Time *this,int64 time,bool utc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  undefined7 in_register_00000011;
  time_t now;
  tm tmBuf;
  long local_48;
  tm local_40;
  
  this->utc = utc;
  local_48 = time / 1000;
  if ((int)CONCAT71(in_register_00000011,utc) == 0) {
    ptVar6 = localtime_r(&local_48,&local_40);
  }
  else {
    ptVar6 = gmtime_r(&local_48,&local_40);
  }
  iVar3 = ptVar6->tm_min;
  iVar4 = ptVar6->tm_hour;
  iVar5 = ptVar6->tm_mday;
  this->sec = ptVar6->tm_sec;
  this->min = iVar3;
  this->hour = iVar4;
  this->day = iVar5;
  uVar1 = ptVar6->tm_mon;
  uVar2 = ptVar6->tm_year;
  this->month = uVar1 + 1;
  this->year = uVar2 + 0x76c;
  iVar3 = ptVar6->tm_yday;
  this->wday = ptVar6->tm_wday;
  this->yday = iVar3;
  this->dst = ptVar6->tm_isdst != 0;
  return;
}

Assistant:

Time::Time(int64 time, bool utc) : utc(utc)
{
  time_t now = (time_t)(time / 1000LL);
#ifdef _WIN32
  tm* tm = utc ? ::gmtime(&now) : ::localtime(&now); // win32 gmtime and localtime are thread save
#else
  struct tm tmBuf;
  tm* tm = utc ? ::gmtime_r(&now, &tmBuf) : ::localtime_r(&now, &tmBuf);
#endif
  sec = tm->tm_sec;
  min = tm->tm_min;
  hour = tm->tm_hour;
  day = tm->tm_mday;
  month = tm->tm_mon + 1;
  year = tm->tm_year + 1900;
  wday = tm->tm_wday;
  yday = tm->tm_yday;
  dst = !!tm->tm_isdst;
}